

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc16.cpp
# Opt level: O0

u16 CalculateCRC16FromBannerData(u8 *banner_data)

{
  ushort uVar1;
  ushort uVar2;
  const_reference pvVar3;
  ulong uStack_48;
  u16 lookup_index;
  size_t i;
  size_t data_size;
  undefined1 auStack_30 [6];
  u16 checksum;
  array<unsigned_short,_16UL> crc_table;
  u8 *banner_data_local;
  
  auStack_30._0_2_ = 0;
  auStack_30._2_2_ = 0xcc01;
  auStack_30._4_2_ = 0xd801;
  checksum = 0x1400;
  crc_table._M_elems[0] = 0xf001;
  crc_table._M_elems[1] = 0x3c00;
  crc_table._M_elems[2] = 0x2800;
  crc_table._M_elems[3] = 0xe401;
  crc_table._M_elems[4] = 0xa001;
  crc_table._M_elems[5] = 0x6c00;
  crc_table._M_elems[6] = 0x7800;
  crc_table._M_elems[7] = 0xb401;
  crc_table._M_elems[8] = 0x5000;
  crc_table._M_elems[9] = 0x9c01;
  crc_table._M_elems[10] = 0x8801;
  crc_table._M_elems[0xb] = 0x4400;
  data_size._6_2_ = 0xffff;
  crc_table._M_elems._24_8_ = banner_data;
  for (uStack_48 = 0; uStack_48 < 0x820; uStack_48 = uStack_48 + 1) {
    pvVar3 = std::array<unsigned_short,_16UL>::operator[]
                       ((array<unsigned_short,_16UL> *)auStack_30,
                        (long)(int)(*(byte *)(crc_table._M_elems._24_8_ + uStack_48) & 0xf));
    uVar1 = *pvVar3;
    pvVar3 = std::array<unsigned_short,_16UL>::operator[]
                       ((array<unsigned_short,_16UL> *)auStack_30,(long)(int)(data_size._6_2_ & 0xf)
                       );
    uVar2 = uVar1 ^ (ushort)((int)(uint)data_size._6_2_ >> 4) ^ *pvVar3;
    pvVar3 = std::array<unsigned_short,_16UL>::operator[]
                       ((array<unsigned_short,_16UL> *)auStack_30,
                        (long)((int)(uint)*(byte *)(crc_table._M_elems._24_8_ + uStack_48) >> 4));
    uVar1 = *pvVar3;
    pvVar3 = std::array<unsigned_short,_16UL>::operator[]
                       ((array<unsigned_short,_16UL> *)auStack_30,(long)(int)(uVar2 & 0xf));
    data_size._6_2_ = uVar1 ^ (ushort)((int)(uint)uVar2 >> 4) ^ *pvVar3;
  }
  return data_size._6_2_;
}

Assistant:

u16 CalculateCRC16FromBannerData(const u8* banner_data) {
    const std::array<u16, 16> crc_table = {
        0x0000, 0xCC01, 0xD801, 0x1400,
        0xF001, 0x3C00, 0x2800, 0xE401,
        0xA001, 0x6C00, 0x7800, 0xB401,
        0x5000, 0x9C01, 0x8801, 0x4400,
    };

    u16 checksum = 0xFFFF;

    const std::size_t data_size = sizeof(Banner) - offsetof(Banner, bitmap);
    for (std::size_t i = 0; i < data_size; i++) {
        u16 lookup_index = crc_table[banner_data[i] & 0xF] ^ (checksum >> 4) ^ crc_table[checksum & 0xF];
        checksum = crc_table[banner_data[i] >> 4] ^ (lookup_index >> 4) ^ crc_table[lookup_index & 0xF];
    }

    return checksum;
}